

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

oonf_layer2_neigh * oonf_layer2_neigh_add_lid(oonf_layer2_net *l2net,oonf_layer2_neigh_key *key)

{
  long lVar1;
  oonf_layer2_metadata *poVar2;
  oonf_layer2_net *local_68;
  oonf_layer2_neighbor_index local_5c;
  oonf_layer2_neighbor_index neighidx;
  oonf_layer2_neigh *l2neigh;
  oonf_layer2_neigh_key *key_local;
  oonf_layer2_net *l2net_local;
  
  if (((key->addr)._type == '/') || ((key->addr)._type == '0')) {
    lVar1 = avl_find(&l2net->neighbors,key);
    if (lVar1 == 0) {
      local_68 = (oonf_layer2_net *)0x0;
    }
    else {
      local_68 = (oonf_layer2_net *)(lVar1 + -0x4c0);
    }
    if (local_68 == (oonf_layer2_net *)0x0) {
      l2net_local = (oonf_layer2_net *)oonf_class_malloc(&_l2neighbor_class);
      if (l2net_local == (oonf_layer2_net *)0x0) {
        l2net_local = (oonf_layer2_net *)0x0;
      }
      else {
        memcpy(l2net_local,key,0x23);
        l2net_local->neighdata[8]._meta = (oonf_layer2_metadata *)l2net_local;
        *(oonf_layer2_net **)(l2net_local->if_ident + 0x18) = l2net;
        avl_insert(&l2net->neighbors,&l2net_local->neighdata[7]._meta);
        avl_init(&l2net_local->if_listener,avl_comp_netaddr,0);
        avl_init(&(l2net_local->if_listener)._node,avl_comp_netaddr,0);
        for (local_5c = OONF_LAYER2_NEIGH_TX_SIGNAL; local_5c < OONF_LAYER2_NEIGH_COUNT;
            local_5c = local_5c + OONF_LAYER2_NEIGH_RX_SIGNAL) {
          poVar2 = oonf_layer2_neigh_metadata_get(local_5c);
          *(oonf_layer2_metadata **)((long)&l2net_local->data[(ulong)local_5c - 2]._value + 8) =
               poVar2;
        }
        oonf_class_event(&_l2neighbor_class,l2net_local,1);
      }
    }
    else {
      l2net_local = local_68;
    }
  }
  else {
    l2net_local = (oonf_layer2_net *)0x0;
  }
  return (oonf_layer2_neigh *)l2net_local;
}

Assistant:

struct oonf_layer2_neigh *
oonf_layer2_neigh_add_lid(struct oonf_layer2_net *l2net, const struct oonf_layer2_neigh_key *key) {
  struct oonf_layer2_neigh *l2neigh;
  enum oonf_layer2_neighbor_index neighidx;

  if (netaddr_get_address_family(&key->addr) != AF_MAC48 && netaddr_get_address_family(&key->addr) != AF_EUI64) {
    return NULL;
  }

  l2neigh = oonf_layer2_neigh_get_lid(l2net, key);
  if (l2neigh) {
    return l2neigh;
  }

  l2neigh = oonf_class_malloc(&_l2neighbor_class);
  if (!l2neigh) {
    return NULL;
  }

  memcpy(&l2neigh->key, key, sizeof(*key));
  l2neigh->_node.key = &l2neigh->key;
  l2neigh->network = l2net;

  avl_insert(&l2net->neighbors, &l2neigh->_node);

  avl_init(&l2neigh->destinations, avl_comp_netaddr, false);
  avl_init(&l2neigh->remote_neighbor_ips, avl_comp_netaddr, false);

  /* initialize metadata */
  for (neighidx=0; neighidx<OONF_LAYER2_NEIGH_COUNT; neighidx++) {
    l2neigh->data[neighidx]._meta = oonf_layer2_neigh_metadata_get(neighidx);
  }

  oonf_class_event(&_l2neighbor_class, l2neigh, OONF_OBJECT_ADDED);

  return l2neigh;
}